

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O1

void StoreDataWithHuffmanCodes
               (uint8_t *input,size_t start_pos,size_t mask,Command *commands,size_t n_commands,
               uint8_t *lit_depth,uint16_t *lit_bits,uint8_t *cmd_depth,uint16_t *cmd_bits,
               uint8_t *dist_depth,uint16_t *dist_bits,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  
  if (n_commands != 0) {
    sVar9 = 0;
    do {
      uVar10 = commands[sVar9].insert_len_;
      uVar11 = (ulong)uVar10;
      uVar4 = commands[sVar9].copy_len_;
      uVar2 = commands[sVar9].cmd_prefix_;
      bVar1 = cmd_depth[uVar2];
      uVar15 = *storage_ix;
      uVar5 = commands[sVar9].dist_extra_;
      uVar3 = commands[sVar9].dist_prefix_;
      *(ulong *)(storage + (uVar15 >> 3)) =
           (ulong)cmd_bits[uVar2] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
      uVar15 = bVar1 + uVar15;
      *storage_ix = uVar15;
      uVar8 = uVar10;
      if (5 < uVar11) {
        if (uVar10 < 0x82) {
          uVar8 = 0x1f;
          uVar13 = (uint)(uVar11 - 2);
          if (uVar13 != 0) {
            for (; uVar13 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          uVar8 = (int)(uVar11 - 2 >> ((char)(uVar8 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                  (uVar8 ^ 0xffffffe0) * 2 + 0x40;
        }
        else if (uVar10 < 0x842) {
          uVar8 = 0x1f;
          if (uVar10 - 0x42 != 0) {
            for (; uVar10 - 0x42 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          uVar8 = (uVar8 ^ 0xffffffe0) + 0x2a;
        }
        else {
          uVar8 = 0x15;
          if (0x1841 < uVar10) {
            uVar8 = 0x17 - (uVar10 < 0x5842);
          }
        }
      }
      bVar1 = (byte)(uVar4 >> 0x18);
      uVar13 = (int)(char)(bVar1 & 0x80 | bVar1 >> 1) + (uVar4 & 0x1ffffff);
      if (uVar13 < 10) {
        uVar14 = uVar13 + 0xfffe;
      }
      else if (uVar13 < 0x86) {
        uVar14 = 0x1f;
        uVar12 = (uint)((ulong)uVar13 - 6);
        if (uVar12 != 0) {
          for (; uVar12 >> uVar14 == 0; uVar14 = uVar14 - 1) {
          }
        }
        uVar14 = (uVar14 ^ 0xffffffe0) * 2 +
                 (int)((ulong)uVar13 - 6 >> ((char)(uVar14 ^ 0xffffffe0) + 0x1fU & 0x3f)) + 0x42;
      }
      else {
        uVar14 = 0x17;
        if (uVar13 < 0x846) {
          uVar14 = 0x1f;
          if (uVar13 - 0x46 != 0) {
            for (; uVar13 - 0x46 >> uVar14 == 0; uVar14 = uVar14 - 1) {
            }
          }
          uVar14 = (uVar14 ^ 0xffffffe0) + 0x2c;
        }
      }
      uVar8 = (uVar8 & 0xffff) << 2;
      iVar6 = *(int *)(duckdb_brotli::kBrotliInsExtra + uVar8);
      uVar14 = (uVar14 & 0xffff) << 2;
      iVar7 = *(int *)(duckdb_brotli::kBrotliCopyExtra + uVar14);
      *(ulong *)(storage + (uVar15 >> 3)) =
           ((ulong)(uVar13 - *(int *)(duckdb_brotli::kBrotliCopyBase + uVar14)) <<
            ((byte)iVar6 & 0x3f) | (ulong)(uVar10 - *(int *)(duckdb_brotli::kBrotliInsBase + uVar8))
           ) << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
      *storage_ix = (uint)(iVar6 + iVar7) + uVar15;
      if (uVar11 != 0) {
        uVar15 = *storage_ix;
        do {
          bVar1 = lit_depth[input[start_pos & mask]];
          *(ulong *)(storage + (uVar15 >> 3)) =
               (ulong)lit_bits[input[start_pos & mask]] << ((byte)uVar15 & 7) |
               (ulong)storage[uVar15 >> 3];
          uVar15 = uVar15 + bVar1;
          *storage_ix = uVar15;
          start_pos = start_pos + 1;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      if (((uVar4 & 0x1ffffff) != 0) && (0x7f < uVar2)) {
        uVar10 = uVar3 & 0x3ff;
        uVar15 = *storage_ix;
        uVar11 = dist_depth[uVar10] + uVar15;
        *(ulong *)(storage + (uVar15 >> 3)) =
             (ulong)dist_bits[uVar10] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
        *storage_ix = uVar11;
        *(ulong *)(storage + (uVar11 >> 3)) =
             (ulong)uVar5 << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
        *storage_ix = uVar11 + (uVar3 >> 10);
      }
      start_pos = start_pos + (uVar4 & 0x1ffffff);
      sVar9 = sVar9 + 1;
    } while (sVar9 != n_commands);
  }
  return;
}

Assistant:

static void StoreDataWithHuffmanCodes(const uint8_t* input,
                                      size_t start_pos,
                                      size_t mask,
                                      const Command* commands,
                                      size_t n_commands,
                                      const uint8_t* lit_depth,
                                      const uint16_t* lit_bits,
                                      const uint8_t* cmd_depth,
                                      const uint16_t* cmd_bits,
                                      const uint8_t* dist_depth,
                                      const uint16_t* dist_bits,
                                      size_t* storage_ix,
                                      uint8_t* storage) {
  size_t pos = start_pos;
  size_t i;
  for (i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    const size_t cmd_code = cmd.cmd_prefix_;
    size_t j;
    BrotliWriteBits(
        cmd_depth[cmd_code], cmd_bits[cmd_code], storage_ix, storage);
    StoreCommandExtra(&cmd, storage_ix, storage);
    for (j = cmd.insert_len_; j != 0; --j) {
      const uint8_t literal = input[pos & mask];
      BrotliWriteBits(
          lit_depth[literal], lit_bits[literal], storage_ix, storage);
      ++pos;
    }
    pos += CommandCopyLen(&cmd);
    if (CommandCopyLen(&cmd) && cmd.cmd_prefix_ >= 128) {
      const size_t dist_code = cmd.dist_prefix_ & 0x3FF;
      const uint32_t distnumextra = cmd.dist_prefix_ >> 10;
      const uint32_t distextra = cmd.dist_extra_;
      BrotliWriteBits(dist_depth[dist_code], dist_bits[dist_code],
                      storage_ix, storage);
      BrotliWriteBits(distnumextra, distextra, storage_ix, storage);
    }
  }
}